

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

string * cs::exception::compose_what(string *file,size_t line,string *code,string *what)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_138 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [72];
  
  __lhs = in_RDI;
  std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffee8);
  std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
  return __lhs;
}

Assistant:

static std::string compose_what(const std::string &file, std::size_t line, const std::string &code, const std::string &what)
		{
			return "File \"" + file + "\", line " + std::to_string(line) + ": " + what + "\n>\t" + code + "\n";
		}